

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void icu_63::mergeTimeZoneKey(UnicodeString *mzID,char *result)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t prefixLen;
  int32_t keyLen;
  char mzIdChar [129];
  char *result_local;
  UnicodeString *mzID_local;
  
  UVar1 = UnicodeString::isEmpty(mzID);
  if (UVar1 == '\0') {
    iVar2 = UnicodeString::length(mzID);
    iVar2 = UnicodeString::extract(mzID,0,iVar2,(char *)&prefixLen,0x81,kInvariant);
    memcpy(result,"meta:",5);
    memcpy(result + 5,&prefixLen,(long)iVar2);
    result[iVar2 + 5] = '\0';
  }
  else {
    *result = '\0';
  }
  return;
}

Assistant:

static void mergeTimeZoneKey(const UnicodeString& mzID, char* result) {
    if (mzID.isEmpty()) {
        result[0] = '\0';
        return;
    }

    char mzIdChar[ZID_KEY_MAX + 1];
    int32_t keyLen;
    int32_t prefixLen = static_cast<int32_t>(uprv_strlen(gMZPrefix));
    keyLen = mzID.extract(0, mzID.length(), mzIdChar, ZID_KEY_MAX + 1, US_INV);
    uprv_memcpy((void *)result, (void *)gMZPrefix, prefixLen);
    uprv_memcpy((void *)(result + prefixLen), (void *)mzIdChar, keyLen);
    result[keyLen + prefixLen] = '\0';
}